

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O3

_Bool set_contains(TSCharacterRange *ranges,uint32_t len,int32_t lookahead)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar1 = 0;
  if (1 < len) {
    do {
      uVar2 = (ulong)((int)uVar1 + (len >> 1));
      if (lookahead <= ranges[uVar2].end && ranges[uVar2].start <= lookahead) {
        return true;
      }
      if (lookahead <= ranges[uVar2].end) {
        uVar2 = uVar1;
      }
      uVar1 = uVar2;
      len = len - (len >> 1);
    } while (1 < len);
  }
  if (ranges[uVar1].start <= lookahead) {
    return lookahead <= ranges[uVar1].end;
  }
  return false;
}

Assistant:

static inline bool set_contains(TSCharacterRange *ranges, uint32_t len, int32_t lookahead) {
  uint32_t index = 0;
  uint32_t size = len - index;
  while (size > 1) {
    uint32_t half_size = size / 2;
    uint32_t mid_index = index + half_size;
    TSCharacterRange *range = &ranges[mid_index];
    if (lookahead >= range->start && lookahead <= range->end) {
      return true;
    } else if (lookahead > range->end) {
      index = mid_index;
    }
    size -= half_size;
  }
  TSCharacterRange *range = &ranges[index];
  return (lookahead >= range->start && lookahead <= range->end);
}